

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O1

void agc_max(agc_t *agc,mfcc_t **mfc,int32 n_frame)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  mfcc_t mVar4;
  
  if (0 < n_frame) {
    agc->obs_max = **mfc;
    if (n_frame != 1) {
      mVar4 = agc->obs_max;
      uVar3 = 1;
      do {
        fVar1 = (float)*mfc[uVar3];
        if ((float)mVar4 < fVar1) {
          agc->obs_max = (mfcc_t)fVar1;
          agc->obs_frame = 1;
          mVar4 = (mfcc_t)fVar1;
        }
        uVar3 = uVar3 + 1;
      } while ((uint)n_frame != uVar3);
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/agc.c"
            ,0x7b,"AGCMax: obs=max= %.2f\n",(double)(float)agc->obs_max);
    uVar3 = 1;
    if (1 < n_frame) {
      uVar3 = (ulong)(uint)n_frame;
    }
    uVar2 = 0;
    do {
      *mfc[uVar2] = (mfcc_t)((float)*mfc[uVar2] - (float)agc->obs_max);
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  return;
}

Assistant:

void
agc_max(agc_t *agc, mfcc_t **mfc, int32 n_frame)
{
    int32 i;

    if (n_frame <= 0)
        return;
    agc->obs_max = mfc[0][0];
    for (i = 1; i < n_frame; i++) {
        if (mfc[i][0] > agc->obs_max) {
            agc->obs_max = mfc[i][0];
            agc->obs_frame = 1;
        }
    }

    E_INFO("AGCMax: obs=max= %.2f\n", agc->obs_max);
    for (i = 0; i < n_frame; i++)
        mfc[i][0] -= agc->obs_max;
}